

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O0

void __thiscall
coro_io::multithread_context_pool::~multithread_context_pool(multithread_context_pool *this)

{
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *in_RDI;
  promise<void> *unaff_retaddr;
  multithread_context_pool *in_stack_00000030;
  
  stop(in_stack_00000030);
  std::promise<void>::~promise(unaff_retaddr);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)unaff_retaddr);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ~ExecutorWrapper(in_RDI);
  std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::~unique_ptr
            ((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
             in_RDI);
  asio::io_context::~io_context((io_context *)0x1c604c);
  return;
}

Assistant:

~multithread_context_pool() { stop(); }